

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O1

void __thiscall
xray_re::_lzhuf::Encode
          (_lzhuf *this,uint8_t **_code,size_t *_codesize,uint8_t *_text,size_t _textsize)

{
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  uint8_t *puVar4;
  long lVar5;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *__stream;
  FILE *extraout_RDX_01;
  FILE *extraout_RDX_02;
  FILE *extraout_RDX_03;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint p;
  int iVar10;
  int iVar11;
  
  this->m_src_limit = _textsize;
  this->m_src_pos = 0;
  this->m_src = _text;
  this->m_dest_limit = _textsize >> 1;
  this->m_dest_pos = 4;
  puVar4 = (uint8_t *)malloc(_textsize >> 1);
  this->m_dest = puVar4;
  *(int *)puVar4 = (int)_textsize;
  this->putbuf = 0;
  this->putlen = '\0';
  StartHuff(this);
  lVar5 = 0x2413;
  do {
    puVar1 = this->text_buf + lVar5 * 4;
    puVar1[0] = '\0';
    puVar1[1] = '\x10';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x2513);
  lVar5 = 0x2513;
  do {
    puVar1 = this->text_buf + lVar5 * 4;
    puVar1[0] = '\0';
    puVar1[1] = '\x10';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x3513);
  memset(this,0x20,0xfc4);
  uVar7 = 0;
  do {
    uVar3 = this->m_src_pos;
    uVar9 = 0xffffffff;
    if (uVar3 < this->m_src_limit) {
      this->m_src_pos = uVar3 + 1;
      uVar9 = (uint)this->m_src[uVar3];
    }
    if ((int)uVar9 < 0) goto LAB_00170996;
    *(char *)((long)this->lson + (uVar7 - 0x80)) = (char)uVar9;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x3c);
  uVar7 = 0x3c;
LAB_00170996:
  this->textsize = uVar7 & 0xffffffff;
  iVar8 = 0xfc3;
  do {
    InsertNode(this,iVar8);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0xf87);
  uVar9 = 0xfc4;
  InsertNode(this,0xfc4);
  p = 0;
  do {
    iVar8 = (int)uVar7;
    if (iVar8 < this->match_length) {
      this->match_length = iVar8;
    }
    if (this->match_length < 3) {
      this->match_length = 1;
      EncodeChar(this,(uint)this->text_buf[(int)uVar9]);
      __stream = extraout_RDX;
    }
    else {
      EncodeChar(this,this->match_length + 0xfd);
      EncodePosition(this,this->match_position);
      __stream = extraout_RDX_00;
    }
    iVar2 = this->match_length;
    if (iVar2 < 1) {
      iVar11 = 0;
    }
    else {
      iVar10 = 0;
      do {
        uVar3 = this->m_src_pos;
        uVar6 = 0xffffffff;
        if (uVar3 < this->m_src_limit) {
          __stream = (FILE *)(uVar3 + 1);
          this->m_src_pos = (size_t)__stream;
          uVar6 = (uint)this->m_src[uVar3];
        }
        iVar11 = iVar10;
        if ((int)uVar6 < 0) break;
        DeleteNode(this,p);
        this->text_buf[(int)p] = (uchar)uVar6;
        if (p < 0x3b) {
          *(uchar *)((long)this->lson + (long)(int)p + -0x44) = (uchar)uVar6;
        }
        p = p + 1 & 0xfff;
        uVar9 = uVar9 + 1 & 0xfff;
        InsertNode(this,uVar9);
        iVar10 = iVar10 + 1;
        __stream = extraout_RDX_01;
        iVar11 = iVar2;
      } while (iVar2 != iVar10);
    }
    if (iVar11 < iVar2) {
      iVar10 = 0;
      do {
        DeleteNode(this,p);
        uVar9 = uVar9 + 1 & 0xfff;
        __stream = extraout_RDX_02;
        if (iVar8 + -1 != iVar10) {
          InsertNode(this,uVar9);
          __stream = extraout_RDX_03;
        }
        p = p + 1 & 0xfff;
        iVar10 = iVar10 + 1;
      } while (iVar2 - iVar11 != iVar10);
      uVar7 = (ulong)(uint)((iVar11 + iVar8) - iVar2);
    }
    if ((int)uVar7 < 1) {
      if (this->putlen != '\0') {
        putc(this,this->putbuf >> 8,__stream);
        this->codesize = this->codesize + 1;
      }
      *_code = this->m_dest;
      *_codesize = this->m_dest_pos;
      return;
    }
  } while( true );
}

Assistant:

void _lzhuf::Encode(uint8_t*& _code, size_t& _codesize, const uint8_t* _text, size_t _textsize)  /* compression */
{
	int i, c, len, r, s, last_match_length;

	m_src_limit = _textsize;
	m_src_pos = 0;
	m_src = _text;

	m_dest_limit = _textsize/2;
	m_dest_pos = 4;
	m_dest = static_cast<uint8_t*>(malloc(m_dest_limit));
	*(uint32_t*)m_dest = uint32_t(_textsize);

	putbuf = 0;
	putlen = 0;

	StartHuff();
	InitTree();
	s = 0;
	r = N - F;
	for (i = s; i < r; i++)
		text_buf[i] = ' ';
	for (len = 0; len < F && (c = getc()) >= 0; len++)
		text_buf[r + len] = c;
	textsize = len;
	for (i = 1; i <= F; i++)
		InsertNode(r - i);
	InsertNode(r);
	do {
		if (match_length > len)
			match_length = len;
		if (match_length <= THRESHOLD) {
			match_length = 1;
			EncodeChar(text_buf[r]);
		} else {
			EncodeChar(255 - THRESHOLD + match_length);
			EncodePosition(match_position);
		}
		last_match_length = match_length;
		for (i = 0; i < last_match_length && (c = getc()) >= 0; i++) {
			DeleteNode(s);
			text_buf[s] = c;
			if (s < F - 1)
				text_buf[s + N] = c;
			s = (s + 1) & (N - 1);
			r = (r + 1) & (N - 1);
			InsertNode(r);
		}
		while (i++ < last_match_length) {
			DeleteNode(s);
			s = (s + 1) & (N - 1);
			r = (r + 1) & (N - 1);
			if (--len) InsertNode(r);
		}
	} while (len > 0);
	EncodeEnd();
	_code = m_dest;
	_codesize = m_dest_pos;
}